

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSort.c
# Opt level: O1

void Msat_SolverSortSelection(Msat_Clause_t **array,int size)

{
  ulong uVar1;
  Msat_Clause_t *pMVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  
  if (1 < size) {
    uVar7 = 1;
    uVar6 = 0;
    do {
      uVar1 = uVar6 + 1;
      uVar4 = uVar6 & 0xffffffff;
      uVar5 = uVar7;
      do {
        fVar8 = Msat_ClauseReadActivity(array[uVar5]);
        fVar9 = Msat_ClauseReadActivity(array[(int)(uint)uVar4]);
        uVar3 = (uint)uVar5;
        if (fVar9 <= fVar8) {
          uVar3 = (uint)uVar4;
        }
        uVar5 = uVar5 + 1;
        uVar4 = (ulong)uVar3;
      } while ((uint)size != uVar5);
      pMVar2 = array[uVar6];
      array[uVar6] = array[(int)uVar3];
      array[(int)uVar3] = pMVar2;
      uVar7 = uVar7 + 1;
      uVar6 = uVar1;
    } while (uVar1 != size - 1);
  }
  return;
}

Assistant:

void Msat_SolverSortSelection( Msat_Clause_t ** array, int size )
{
    Msat_Clause_t * tmp;
    int i, j, best_i;
    for ( i = 0; i < size-1; i++ )
    {
        best_i = i;
        for (j = i+1; j < size; j++)
        {
            if ( Msat_ClauseReadActivity(array[j]) < Msat_ClauseReadActivity(array[best_i]) )
                best_i = j;
        }
        tmp = array[i]; array[i] = array[best_i]; array[best_i] = tmp;
    }
}